

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  uint a;
  int iVar4;
  uint uVar5;
  uint uVar6;
  parasail_result_t *ppVar7;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar25 [16];
  uint uVar29;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined1 auVar30 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  __m128i_32_t A;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  int32_t iVar79;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  undefined1 local_188 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  long local_128;
  int *local_120;
  ulong local_118;
  ulong local_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  undefined4 uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar21 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar23 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar23 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar23;
  iVar4 = a + 3;
  uVar5 = s2Len + 3;
  iVar14 = -open;
  iVar20 = matrix->min;
  uVar15 = 0x80000000 - iVar20;
  if (iVar20 != iVar14 && SBORROW4(iVar20,iVar14) == iVar20 + open < 0) {
    uVar15 = open | 0x80000000;
  }
  uVar15 = uVar15 + 1;
  uVar13 = 0x7ffffffe - matrix->max;
  local_188 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_108 = gap << 2;
    iStack_104 = gap << 2;
    iStack_100 = gap << 2;
    iStack_fc = gap << 2;
  }
  else {
    local_108 = 0;
    iStack_104 = 0;
    iStack_100 = 0;
    iStack_fc = 0;
  }
  local_138 = CONCAT44(uVar15,uVar15);
  uStack_130 = CONCAT44(uVar15,uVar15);
  if (s1_beg == 0) {
    local_188._4_4_ = iVar14 + gap * -2;
    local_188._0_4_ = -(gap * 3 + open);
    local_188._12_4_ = iVar14;
    local_188._8_4_ = iVar14 - gap;
  }
  local_f8 = local_138;
  uStack_f0 = uStack_130;
  local_e8 = local_138;
  uStack_e0 = uStack_130;
  local_d8 = local_138;
  uStack_d0 = uStack_130;
  local_c8 = local_138;
  uStack_c0 = uStack_130;
  local_58 = gap;
  iStack_54 = gap;
  iStack_50 = gap;
  iStack_4c = gap;
  ppVar7 = parasail_result_new_table1(a,s2Len);
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x4421002;
  uVar11 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar11);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar11);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar11);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar4);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar2 = matrix->mapper;
      uVar11 = 0;
      do {
        ptr_02[uVar11] = piVar2[(byte)_s1[uVar11]];
        uVar11 = uVar11 + 1;
      } while (uVar23 != uVar11);
    }
    iVar20 = a + 1;
    if ((int)(a + 1) < iVar4) {
      iVar20 = iVar4;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar20) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_a8 = a - 1;
  uStack_a4 = a - 1;
  uStack_a0 = a - 1;
  uStack_9c = a - 1;
  local_78 = s2Len - 1;
  uStack_74 = s2Len - 1;
  uStack_70 = s2Len - 1;
  uStack_6c = s2Len - 1;
  piVar2 = matrix->mapper;
  uVar11 = 0;
  do {
    ptr[uVar11 + 3] = piVar2[(byte)_s2[uVar11]];
    uVar11 = uVar11 + 1;
  } while (uVar21 != uVar11);
  ptr[2] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  uVar9 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar5) {
    uVar9 = uVar5;
  }
  local_98 = open;
  iStack_94 = open;
  iStack_90 = open;
  iStack_8c = open;
  local_88 = s2Len;
  iStack_84 = s2Len;
  iStack_80 = s2Len;
  iStack_7c = s2Len;
  local_68 = a;
  uStack_64 = a;
  uStack_60 = a;
  uStack_5c = a;
  memset(ptr + uVar21 + 3,0,(ulong)(~s2Len + uVar9) * 4 + 4);
  if (s2_beg == 0) {
    uVar11 = 0;
    iVar20 = iVar14;
    do {
      ptr_00[uVar11 + 3] = iVar20;
      ptr_01[uVar11 + 3] = uVar15;
      uVar11 = uVar11 + 1;
      iVar20 = iVar20 - gap;
    } while (uVar21 != uVar11);
  }
  else {
    uVar11 = 0;
    do {
      ptr_00[uVar11 + 3] = 0;
      ptr_01[uVar11 + 3] = uVar15;
      uVar11 = uVar11 + 1;
    } while (uVar21 != uVar11);
  }
  lVar8 = 0;
  do {
    ptr_00[lVar8] = uVar15;
    ptr_01[lVar8] = uVar15;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = uVar21 + 3;
  uVar11 = uVar21;
  do {
    ptr_00[lVar8] = uVar15;
    ptr_01[lVar8] = uVar15;
    lVar8 = lVar8 + 1;
    uVar9 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar9;
  } while ((int)uVar9 < (int)uVar5);
  ptr_00[2] = 0;
  uVar9 = uVar15;
  uVar41 = uVar15;
  uVar42 = uVar15;
  uVar43 = uVar15;
  uVar64 = uVar15;
  uVar66 = uVar15;
  uVar68 = uVar15;
  uVar71 = uVar15;
  uVar37 = uVar15;
  uVar38 = uVar15;
  uVar39 = uVar15;
  uVar40 = uVar15;
  local_148 = uVar15;
  uStack_144 = uVar15;
  uStack_140 = uVar15;
  uStack_13c = uVar15;
  local_158 = uVar13;
  uStack_154 = uVar13;
  uStack_150 = uVar13;
  uStack_14c = uVar13;
  if (0 < (int)a) {
    local_120 = matrix->matrix;
    uVar6 = a - 1;
    local_b8 = uVar15;
    uStack_b4 = uVar15;
    uStack_b0 = uVar15;
    uStack_ac = 0;
    local_110 = 1;
    if (1 < (int)uVar5) {
      local_110 = (ulong)uVar5;
    }
    local_190 = uVar21 * 0xc + -0xc;
    local_128 = uVar21 * 0x10;
    local_198 = uVar21 * 4 + -4;
    local_1a8 = uVar21 * 8 + -8;
    local_1c8 = 3;
    uStack_1c4 = 2;
    uStack_1c0 = 1;
    uStack_1bc = 0;
    local_1a0 = 0;
    uVar11 = 0;
    uVar5 = uVar15;
    uVar34 = uVar15;
    uVar35 = uVar15;
    uVar36 = uVar15;
    uVar29 = uVar15;
    uVar31 = uVar15;
    uVar32 = uVar15;
    uVar33 = uVar15;
    do {
      uVar16 = uVar11 | 3;
      uVar17 = (uint)uVar11;
      if (matrix->type == 0) {
        uVar10 = ptr_02[uVar11 + 1];
        uVar12 = ptr_02[uVar11 + 2];
        uVar19 = ptr_02[uVar11];
        uVar22 = ptr_02[uVar16];
      }
      else {
        uVar10 = uVar17 | 1;
        if (uVar23 <= (uVar11 | 1)) {
          uVar10 = uVar6;
        }
        uVar12 = uVar17 | 2;
        if (uVar23 <= (uVar11 | 2)) {
          uVar12 = uVar6;
        }
        uVar19 = uVar17;
        uVar22 = uVar17 | 3;
        if (uVar23 <= uVar16) {
          uVar22 = uVar6;
        }
      }
      iVar20 = matrix->size;
      local_118 = uVar11 + 4;
      uVar17 = iVar14 - uVar17 * gap;
      iVar79 = ptr_00[2];
      ptr_00[2] = iVar14 - (int)local_118 * gap;
      if (s1_beg != 0) {
        uVar17 = 0;
      }
      local_48 = -(uint)(local_a8 == local_1c8);
      uStack_44 = -(uint)(uStack_a4 == uStack_1c4);
      uStack_40 = -(uint)(uStack_a0 == uStack_1c0);
      uStack_3c = -(uint)(uStack_9c == uStack_1bc);
      uVar18 = 0;
      uVar24 = 0xfffffffd;
      uVar26 = 0xfffffffe;
      uVar27 = 0xffffffff;
      uVar28 = 0;
      uVar76 = uVar15;
      uVar77 = uVar15;
      uVar78 = uVar15;
      uVar44 = uVar15;
      uVar59 = uVar15;
      uVar60 = uVar15;
      uVar46 = uVar15;
      uVar48 = uVar15;
      uVar50 = uVar15;
      uVar61 = uVar15;
      uVar45 = uVar15;
      uVar47 = uVar15;
      uVar49 = uVar15;
      do {
        iVar4 = ptr_00[uVar18 + 3];
        uVar69 = iVar4 - iStack_8c;
        uVar51 = -(uint)((int)(uVar45 - local_58) < (int)(uVar59 - local_98));
        uVar53 = -(uint)((int)(uVar47 - iStack_54) < (int)(uVar60 - iStack_94));
        uVar55 = -(uint)((int)(uVar49 - iStack_50) < (int)(uVar17 - iStack_90));
        uVar57 = -(uint)(ptr_01[uVar18 + 3] - iStack_4c < (int)uVar69);
        uVar51 = ~uVar51 & uVar45 - local_58 | uVar59 - local_98 & uVar51;
        uVar45 = ~uVar53 & uVar47 - iStack_54 | uVar60 - iStack_94 & uVar53;
        uVar47 = ~uVar55 & uVar49 - iStack_50 | uVar17 - iStack_90 & uVar55;
        uVar49 = ~uVar57 & ptr_01[uVar18 + 3] - iStack_4c | uVar69 & uVar57;
        uVar53 = -(uint)((int)(uVar46 - local_58) < (int)(uVar44 - local_98));
        uVar55 = -(uint)((int)(uVar48 - iStack_54) < (int)(uVar59 - iStack_94));
        uVar57 = -(uint)((int)(uVar50 - iStack_50) < (int)(uVar60 - iStack_90));
        uVar69 = -(uint)((int)(uVar61 - iStack_4c) < (int)(uVar17 - iStack_8c));
        uVar52 = ~uVar53 & uVar46 - local_58 | uVar44 - local_98 & uVar53;
        uVar54 = ~uVar55 & uVar48 - iStack_54 | uVar59 - iStack_94 & uVar55;
        uVar56 = ~uVar57 & uVar50 - iStack_50 | uVar60 - iStack_90 & uVar57;
        uVar58 = ~uVar69 & uVar61 - iStack_4c | uVar17 - iStack_8c & uVar69;
        uVar44 = -(uint)((int)uVar52 <
                        (int)(local_120[(long)(int)(uVar22 * iVar20) + (long)ptr[uVar18]] + uVar76))
        ;
        uVar46 = -(uint)((int)uVar54 <
                        (int)(local_120[(long)(int)(uVar12 * iVar20) + (long)ptr[uVar18 + 1]] +
                             uVar77));
        uVar48 = -(uint)((int)uVar56 <
                        (int)(local_120[(long)(int)(uVar10 * iVar20) + (long)ptr[uVar18 + 2]] +
                             uVar78));
        uVar50 = -(uint)((int)uVar58 <
                        local_120[(long)(int)(uVar19 * iVar20) + (long)ptr[uVar18 + 3]] + iVar79);
        uVar76 = ~uVar44 & uVar52 |
                 local_120[(long)(int)(uVar22 * iVar20) + (long)ptr[uVar18]] + uVar76 & uVar44;
        uVar77 = ~uVar46 & uVar54 |
                 local_120[(long)(int)(uVar12 * iVar20) + (long)ptr[uVar18 + 1]] + uVar77 & uVar46;
        uVar78 = ~uVar48 & uVar56 |
                 local_120[(long)(int)(uVar10 * iVar20) + (long)ptr[uVar18 + 2]] + uVar78 & uVar48;
        uVar44 = ~uVar50 & uVar58 |
                 local_120[(long)(int)(uVar19 * iVar20) + (long)ptr[uVar18 + 3]] + iVar79 & uVar50;
        uVar46 = -(uint)((int)uVar51 < (int)uVar76);
        uVar48 = -(uint)((int)uVar45 < (int)uVar77);
        uVar50 = -(uint)((int)uVar47 < (int)uVar78);
        uVar61 = -(uint)((int)uVar49 < (int)uVar44);
        uVar76 = ~uVar46 & uVar51 | uVar76 & uVar46;
        uVar77 = ~uVar48 & uVar45 | uVar77 & uVar48;
        uVar78 = ~uVar50 & uVar47 | uVar78 & uVar50;
        uVar69 = ~uVar61 & uVar49 | uVar44 & uVar61;
        uVar62 = -(uint)(uVar24 == 0xffffffff);
        uVar48 = -(uint)(uVar26 == 0xffffffff);
        uVar50 = -(uint)(uVar27 == 0xffffffff);
        uVar61 = -(uint)(uVar28 == 0xffffffff);
        uVar44 = local_188._0_4_ & uVar62 | ~uVar62 & uVar76;
        uVar53 = local_188._4_4_ & uVar48 | ~uVar48 & uVar77;
        uVar55 = local_188._8_4_ & uVar50 | ~uVar50 & uVar78;
        uVar57 = local_188._12_4_ & uVar61 | ~uVar61 & uVar69;
        if (3 < uVar18) {
          local_158 = ~-(uint)((int)uVar44 < (int)local_158) & local_158 |
                      uVar44 & -(uint)((int)uVar44 < (int)local_158);
          uStack_154 = ~-(uint)((int)uVar53 < (int)uStack_154) & uStack_154 |
                       uVar53 & -(uint)((int)uVar53 < (int)uStack_154);
          uStack_150 = ~-(uint)((int)uVar55 < (int)uStack_150) & uStack_150 |
                       uVar55 & -(uint)((int)uVar55 < (int)uStack_150);
          uStack_14c = ~-(uint)((int)uVar57 < (int)uStack_14c) & uStack_14c |
                       uVar57 & -(uint)((int)uVar57 < (int)uStack_14c);
          local_148 = local_148 & -(uint)((int)uVar44 < (int)local_148) |
                      ~-(uint)((int)uVar44 < (int)local_148) & uVar44;
          uStack_144 = uStack_144 & -(uint)((int)uVar53 < (int)uStack_144) |
                       ~-(uint)((int)uVar53 < (int)uStack_144) & uVar53;
          uStack_140 = uStack_140 & -(uint)((int)uVar55 < (int)uStack_140) |
                       ~-(uint)((int)uVar55 < (int)uStack_140) & uVar55;
          uStack_13c = uStack_13c & -(uint)((int)uVar57 < (int)uStack_13c) |
                       ~-(uint)((int)uVar57 < (int)uStack_13c) & uVar57;
        }
        piVar2 = ((ppVar7->field_4).rowcols)->score_row;
        if (uVar18 < uVar21) {
          *(uint *)((long)piVar2 + uVar18 * 4 + local_1a0) = uVar57;
        }
        if (uVar18 - 1 < uVar21 && (uVar11 | 1) < uVar23) {
          *(uint *)((long)piVar2 + uVar18 * 4 + local_198) = uVar55;
        }
        if (((uVar11 | 2) < uVar23) && ((long)(uVar18 - 2) < (long)uVar21 && 1 < uVar18)) {
          *(uint *)((long)piVar2 + uVar18 * 4 + local_1a8) = uVar53;
        }
        uVar45 = ~uVar48 & uVar45 | uVar15 & uVar48;
        uVar47 = ~uVar50 & uVar47 | uVar15 & uVar50;
        uVar49 = ~uVar61 & uVar49 | uVar15 & uVar61;
        if (2 < uVar18 && uVar16 < uVar23) {
          *(uint *)((long)piVar2 + uVar18 * 4 + local_190) = uVar44;
        }
        uVar46 = uVar15 & uVar62 | ~uVar62 & uVar52;
        uVar48 = uVar15 & uVar48 | ~uVar48 & uVar54;
        uVar50 = uVar15 & uVar50 | ~uVar50 & uVar56;
        uVar61 = uVar15 & uVar61 | ~uVar61 & uVar58;
        uVar63 = ~((int)uVar24 >> 0x1f) & -(uint)((int)uVar24 < local_88) & local_48 &
                 -(uint)((int)uVar5 < (int)uVar44);
        uVar65 = ~((int)uVar26 >> 0x1f) & -(uint)((int)uVar26 < iStack_84) & uStack_44 &
                 -(uint)((int)uVar34 < (int)uVar53);
        uVar67 = ~((int)uVar27 >> 0x1f) & -(uint)((int)uVar27 < iStack_80) & uStack_40 &
                 -(uint)((int)uVar35 < (int)uVar55);
        uVar70 = ~((int)uVar28 >> 0x1f) & -(uint)((int)uVar28 < iStack_7c) & uStack_3c &
                 -(uint)((int)uVar36 < (int)uVar57);
        uVar52 = -(uint)((int)uVar29 < (int)uVar44 &&
                        ((int)local_1c8 < (int)local_68 && local_78 == uVar24));
        uVar54 = -(uint)((int)uVar31 < (int)uVar53 &&
                        ((int)uStack_1c4 < (int)uStack_64 && uStack_74 == uVar26));
        uVar56 = -(uint)((int)uVar32 < (int)uVar55 &&
                        ((int)uStack_1c0 < (int)uStack_60 && uStack_70 == uVar27));
        uVar58 = -(uint)((int)uVar33 < (int)uVar57 &&
                        ((int)uStack_1bc < (int)uStack_5c && uStack_6c == uVar28));
        uVar72 = -(uint)(local_78 == uVar24 && local_a8 == local_1c8);
        uVar73 = -(uint)(uStack_74 == uVar26 && uStack_a4 == uStack_1c4);
        uVar74 = -(uint)(uStack_70 == uVar27 && uStack_a0 == uStack_1c0);
        uVar75 = -(uint)(uStack_6c == uVar28 && uStack_9c == uStack_1bc);
        uVar5 = uVar76 & uVar63 | ~uVar63 & uVar5;
        uVar34 = uVar77 & uVar65 | ~uVar65 & uVar34;
        uVar35 = uVar78 & uVar67 | ~uVar67 & uVar35;
        uVar36 = uVar69 & uVar70 | ~uVar70 & uVar36;
        uVar29 = uVar44 & uVar52 | ~uVar52 & uVar29;
        uVar31 = uVar53 & uVar54 | ~uVar54 & uVar31;
        uVar32 = uVar55 & uVar56 | ~uVar56 & uVar32;
        uVar33 = uVar57 & uVar58 | ~uVar58 & uVar33;
        uVar9 = ~uVar72 & uVar9 | uVar44 & uVar72;
        uVar41 = ~uVar73 & uVar41 | uVar53 & uVar73;
        uVar42 = ~uVar74 & uVar42 | uVar55 & uVar74;
        uVar43 = ~uVar75 & uVar43 | uVar57 & uVar75;
        uVar37 = ~uVar52 & uVar37 | local_1c8 & uVar52;
        uVar38 = ~uVar54 & uVar38 | uStack_1c4 & uVar54;
        uVar39 = ~uVar56 & uVar39 | uStack_1c0 & uVar56;
        uVar40 = ~uVar58 & uVar40 | uStack_1bc & uVar58;
        uVar64 = ~uVar63 & uVar64 | uVar24 & uVar63;
        uVar66 = ~uVar65 & uVar66 | uVar26 & uVar65;
        uVar68 = ~uVar67 & uVar68 | uVar27 & uVar67;
        uVar71 = ~uVar70 & uVar71 | uVar28 & uVar70;
        ptr_00[uVar18] = uVar44;
        ptr_01[uVar18] = ~uVar62 & uVar51 | uVar15 & uVar62;
        uVar24 = uVar24 + 1;
        uVar26 = uVar26 + 1;
        uVar27 = uVar27 + 1;
        uVar28 = uVar28 + 1;
        uVar18 = uVar18 + 1;
        uVar76 = uVar59;
        uVar77 = uVar60;
        uVar78 = uVar17;
        iVar79 = iVar4;
        uVar59 = uVar53;
        uVar60 = uVar55;
        uVar17 = uVar57;
      } while (local_110 != uVar18);
      local_1c8 = local_1c8 + 4;
      uStack_1c4 = uStack_1c4 + 4;
      uStack_1c0 = uStack_1c0 + 4;
      uStack_1bc = uStack_1bc + 4;
      local_188._4_4_ = local_188._4_4_ - iStack_104;
      local_188._0_4_ = local_188._0_4_ - local_108;
      local_188._8_4_ = local_188._8_4_ - iStack_100;
      local_188._12_4_ = local_188._12_4_ - iStack_fc;
      local_190 = local_190 + local_128;
      local_1a0 = local_1a0 + local_128;
      local_198 = local_198 + local_128;
      local_1a8 = local_1a8 + local_128;
      uVar11 = local_118;
    } while (local_118 < uVar23);
    local_c8 = CONCAT44(uVar34,uVar5);
    uStack_c0 = CONCAT44(uVar36,uVar35);
    local_d8 = CONCAT44(uVar31,uVar29);
    uStack_d0 = CONCAT44(uVar33,uVar32);
  }
  local_e8 = CONCAT44(uVar41,uVar9);
  uStack_e0 = CONCAT44(uVar43,uVar42);
  local_138 = CONCAT44(uVar38,uVar37);
  uStack_130 = CONCAT44(uVar40,uVar39);
  local_f8 = CONCAT44(uVar66,uVar64);
  uStack_f0 = CONCAT44(uVar71,uVar68);
  lVar8 = 0;
  iVar14 = 0;
  iVar20 = 0;
  iVar4 = 0;
  uVar5 = uVar15;
  uVar9 = uVar15;
  uVar41 = uVar15;
  do {
    uVar42 = *(uint *)((long)&local_d8 + lVar8 * 4);
    if ((int)uVar9 < (int)uVar42) {
      iVar20 = *(int *)((long)&local_138 + lVar8 * 4);
      iVar14 = iVar20;
      uVar9 = uVar42;
    }
    else if ((uVar42 == uVar9) &&
            (iVar1 = *(int *)((long)&local_138 + lVar8 * 4), bVar3 = iVar1 < iVar20, iVar20 = iVar14
            , bVar3)) {
      iVar20 = iVar1;
      iVar14 = iVar1;
      uVar9 = uVar42;
    }
    uVar42 = *(uint *)((long)&local_c8 + lVar8 * 4);
    if ((int)uVar41 < (int)uVar42) {
      iVar4 = *(int *)((long)&local_f8 + lVar8 * 4);
      uVar41 = uVar42;
    }
    uVar42 = *(uint *)((long)&local_e8 + lVar8 * 4);
    if ((int)uVar5 < (int)uVar42) {
      uVar5 = uVar42;
    }
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 4);
  iVar14 = iVar4;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_005b8369;
    iVar14 = s2Len + -1;
    if (s2_end != 0) {
      uVar5 = uVar41;
      iVar14 = iVar4;
    }
  }
  else {
    if ((int)uVar41 < (int)uVar9) {
LAB_005b8369:
      iVar4 = s2Len + -1;
      iVar1 = iVar4;
      goto LAB_005b83c7;
    }
    uVar5 = uVar41;
    if ((uVar9 == uVar41) && (iVar1 = s2Len + -1, iVar4 == s2Len + -1)) goto LAB_005b83c7;
  }
  uVar9 = uVar5;
  iVar20 = a - 1;
  iVar1 = iVar14;
LAB_005b83c7:
  auVar25._0_4_ = -(uint)((int)local_158 < (int)uVar15);
  auVar25._4_4_ = -(uint)((int)uStack_154 < (int)uVar15);
  auVar25._8_4_ = -(uint)((int)uStack_150 < (int)uVar15);
  auVar25._12_4_ = -(uint)((int)uStack_14c < (int)uVar15);
  auVar30._0_4_ = -(uint)((int)uVar13 < (int)local_148);
  auVar30._4_4_ = -(uint)((int)uVar13 < (int)uStack_144);
  auVar30._8_4_ = -(uint)((int)uVar13 < (int)uStack_140);
  auVar30._12_4_ = -(uint)((int)uVar13 < (int)uStack_13c);
  iVar4 = movmskps(iVar4,auVar30 | auVar25);
  if (iVar4 != 0) {
    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
    uVar9 = 0;
    iVar1 = 0;
    iVar20 = 0;
  }
  ppVar7->score = uVar9;
  ppVar7->end_query = iVar20;
  ppVar7->end_ref = iVar1;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar7;
  }
  return ppVar7;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}